

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramUniformTests.cpp
# Opt level: O0

bool __thiscall
deqp::gles31::Functional::UniformAssignCase::test
          (UniformAssignCase *this,
          vector<deqp::gles31::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniform>_>
          *basicUniforms,
          vector<deqp::gles31::Functional::UniformCase::BasicUniformReportRef,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniformReportRef>_>
          *basicUniformReportsRef,ShaderProgram *program,Random *rnd)

{
  ScopedLogSection SVar1;
  bool bVar2;
  deUint32 dVar3;
  TestLog *log_00;
  allocator<char> local_1c9;
  undefined1 local_1c8 [6];
  bool success_2;
  allocator<char> local_1a1;
  string local_1a0;
  ScopedLogSection local_180;
  ScopedLogSection section_3;
  undefined1 local_170 [6];
  bool success_1;
  allocator<char> local_149;
  string local_148;
  ScopedLogSection local_128;
  ScopedLogSection section_2;
  undefined1 local_118 [6];
  bool success;
  allocator<char> local_f1;
  string local_f0;
  ScopedLogSection local_d0;
  ScopedLogSection section_1;
  vector<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
  values;
  string local_a8;
  allocator<char> local_71;
  string local_70;
  ScopedLogSection local_50;
  ScopedLogSection section;
  TestLog *log;
  deUint32 programGL;
  Random *rnd_local;
  ShaderProgram *program_local;
  vector<deqp::gles31::Functional::UniformCase::BasicUniformReportRef,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniformReportRef>_>
  *basicUniformReportsRef_local;
  vector<deqp::gles31::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniform>_>
  *basicUniforms_local;
  UniformAssignCase *this_local;
  
  dVar3 = glu::ShaderProgram::getProgram(program);
  log_00 = tcu::TestContext::getLog
                     ((this->super_UniformCase).super_TestCase.super_TestCase.super_TestNode.
                      m_testCtx);
  section.m_log = log_00;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"UniformAssign",&local_71);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,"Uniform value assignments",
             (allocator<char> *)
             ((long)&values.
                     super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  tcu::ScopedLogSection::ScopedLogSection(&local_50,log_00,&local_70,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&values.
                     super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  UniformCase::assignUniforms(&this->super_UniformCase,basicUniforms,dVar3,rnd);
  tcu::ScopedLogSection::~ScopedLogSection(&local_50);
  SVar1 = section;
  if (this->m_checkMethod == CHECKMETHOD_GET_UNIFORM) {
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
    ::vector((vector<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
              *)&section_1);
    SVar1 = section;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"GetUniforms",&local_f1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_118,"Uniform value query",
               (allocator<char> *)((long)&section_2.m_log + 7));
    tcu::ScopedLogSection::ScopedLogSection(&local_d0,SVar1.m_log,&local_f0,(string *)local_118);
    std::__cxx11::string::~string((string *)local_118);
    std::allocator<char>::~allocator((allocator<char> *)((long)&section_2.m_log + 7));
    std::__cxx11::string::~string((string *)&local_f0);
    std::allocator<char>::~allocator(&local_f1);
    dVar3 = glu::ShaderProgram::getProgram(program);
    section_2.m_log._6_1_ =
         UniformCase::getUniforms
                   (&this->super_UniformCase,
                    (vector<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                     *)&section_1,basicUniforms,dVar3);
    if (!(bool)section_2.m_log._6_1_) {
      this_local._7_1_ = 0;
    }
    section_2.m_log._1_3_ = 0;
    section_2.m_log._0_1_ = !(bool)section_2.m_log._6_1_;
    tcu::ScopedLogSection::~ScopedLogSection(&local_d0);
    SVar1 = section;
    if ((uint)section_2.m_log == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_148,"ValueCheck",&local_149);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_170,"Verify that the reported values match the assigned values",
                 (allocator<char> *)((long)&section_3.m_log + 7));
      tcu::ScopedLogSection::ScopedLogSection(&local_128,SVar1.m_log,&local_148,(string *)local_170)
      ;
      std::__cxx11::string::~string((string *)local_170);
      std::allocator<char>::~allocator((allocator<char> *)((long)&section_3.m_log + 7));
      std::__cxx11::string::~string((string *)&local_148);
      std::allocator<char>::~allocator(&local_149);
      section_3.m_log._6_1_ =
           UniformCase::compareUniformValues
                     (&this->super_UniformCase,
                      (vector<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                       *)&section_1,basicUniforms);
      if (!(bool)section_3.m_log._6_1_) {
        this_local._7_1_ = 0;
      }
      section_2.m_log._1_3_ = 0;
      section_2.m_log._0_1_ = !(bool)section_3.m_log._6_1_;
      tcu::ScopedLogSection::~ScopedLogSection(&local_128);
      if ((uint)section_2.m_log == 0) {
        section_2.m_log._0_4_ = 0;
      }
    }
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
    ::~vector((vector<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
               *)&section_1);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a0,"RenderTest",&local_1a1)
    ;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_1c8,"Render test",&local_1c9)
    ;
    tcu::ScopedLogSection::ScopedLogSection(&local_180,SVar1.m_log,&local_1a0,(string *)local_1c8);
    std::__cxx11::string::~string((string *)local_1c8);
    std::allocator<char>::~allocator(&local_1c9);
    std::__cxx11::string::~string((string *)&local_1a0);
    std::allocator<char>::~allocator(&local_1a1);
    bVar2 = UniformCase::renderTest(&this->super_UniformCase,basicUniforms,program,rnd);
    if (!bVar2) {
      this_local._7_1_ = 0;
    }
    section_2.m_log._1_3_ = 0;
    section_2.m_log._0_1_ = !bVar2;
    tcu::ScopedLogSection::~ScopedLogSection(&local_180);
  }
  if ((uint)section_2.m_log == 0) {
    this_local._7_1_ = 1;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool UniformAssignCase::test (const vector<BasicUniform>& basicUniforms, const vector<BasicUniformReportRef>& basicUniformReportsRef, const ShaderProgram& program, Random& rnd)
{
	DE_UNREF(basicUniformReportsRef);

	const deUint32	programGL	= program.getProgram();
	TestLog&		log			= m_testCtx.getLog();

	{
		const ScopedLogSection section(log, "UniformAssign", "Uniform value assignments");
		assignUniforms(basicUniforms, programGL, rnd);
	}

	if (m_checkMethod == CHECKMETHOD_GET_UNIFORM)
	{
		vector<VarValue> values;

		{
			const ScopedLogSection section(log, "GetUniforms", "Uniform value query");
			const bool success = getUniforms(values, basicUniforms, program.getProgram());

			if (!success)
				return false;
		}

		{
			const ScopedLogSection section(log, "ValueCheck", "Verify that the reported values match the assigned values");
			const bool success = compareUniformValues(values, basicUniforms);

			if (!success)
				return false;
		}
	}
	else
	{
		DE_ASSERT(m_checkMethod == CHECKMETHOD_RENDER);

		const ScopedLogSection section(log, "RenderTest", "Render test");
		const bool success = renderTest(basicUniforms, program, rnd);

		if (!success)
			return false;
	}

	return true;
}